

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

string * __thiscall
CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  undefined8 *puVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  ostringstream s;
  undefined1 auStack_1a8 [376];
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  puVar3 = *(undefined8 **)this;
  puVar1 = *(undefined8 **)(this + 8);
  if (puVar3 != puVar1) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1a8,(char *)*puVar3,puVar3[1]);
    puVar3 = puVar3 + 4;
  }
  for (; puVar3 != puVar1; puVar3 = puVar3 + 4) {
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)auStack_1a8,
                        (char *)(v->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                        (long)(v->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*puVar3,puVar3[1]);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  ::std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    auto beg = std::begin(v);
    auto end = std::end(v);
    if(beg != end)
        s << *beg++;
    while(beg != end) {
        s << delim << *beg++;
    }
    return s.str();
}